

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_console_outputter.hpp
# Opt level: O1

void __thiscall
hayai::ConsoleOutputter::BeginTest
          (ConsoleOutputter *this,string *fixtureName,string *testName,
          TestParametersDescriptor *parameters,size_t *runsCount,size_t *iterationsCount)

{
  BeginOrSkipTest(this,fixtureName,testName,parameters,runsCount,iterationsCount,false);
  return;
}

Assistant:

virtual void BeginTest(const std::string& fixtureName,
                               const std::string& testName,
                               const TestParametersDescriptor& parameters,
                               const std::size_t& runsCount,
                               const std::size_t& iterationsCount)
        {
            BeginOrSkipTest(fixtureName,
                            testName,
                            parameters,
                            runsCount,
                            iterationsCount,
                            false);
        }